

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O0

int parse_color_config(aom_read_bit_buffer *reader,Av1Config *config)

{
  undefined8 uVar1;
  uint uVar2;
  long in_RSI;
  long in_RDI;
  int separate_uv_delta_q;
  int chroma_sample_position;
  int subsampling_y;
  int subsampling_x;
  int color_range_1;
  int color_range;
  int matrix_coefficients_val;
  int transfer_characteristics_val;
  int color_primaries_val;
  int color_description_present_flag;
  int matrix_coefficients;
  int transfer_characteristics;
  int color_primaries;
  int mono_chrome;
  int twelve_bit;
  int bit_depth;
  int high_bitdepth;
  void *original_error_handler_data;
  int result;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_30;
  int local_1c;
  long local_18;
  long local_10;
  int local_4;
  
  local_1c = 0;
  uVar1 = *(undefined8 *)(in_RDI + 0x18);
  *(int **)(in_RDI + 0x18) = &local_1c;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (local_1c == -1) {
    fprintf(_stderr,"av1c: Error reading bit for high_bitdepth, value=%d result=%d.\n",(ulong)uVar2,
            0xffffffff);
    local_4 = -1;
  }
  else {
    *(char *)(local_18 + 5) = (char)uVar2;
    if ((*(char *)(local_18 + 2) == '\x02') && (*(char *)(local_18 + 5) != '\0')) {
      uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if (local_1c == -1) {
        fprintf(_stderr,"av1c: Error reading bit for twelve_bit, value=%d result=%d.\n",(ulong)uVar2
                ,0xffffffff);
        return -1;
      }
      *(char *)(local_18 + 6) = (char)uVar2;
      local_30 = 10;
      if (*(char *)(local_18 + 6) != '\0') {
        local_30 = 0xc;
      }
    }
    else {
      local_30 = 8;
      if (*(char *)(local_18 + 5) != '\0') {
        local_30 = 10;
      }
    }
    if (*(char *)(local_18 + 2) != '\x01') {
      uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if (local_1c == -1) {
        fprintf(_stderr,"av1c: Error reading bit for mono_chrome, value=%d result=%d.\n",
                (ulong)uVar2,0xffffffff);
        return -1;
      }
      *(char *)(local_18 + 7) = (char)uVar2;
    }
    local_3c = 2;
    local_40 = 2;
    local_44 = 2;
    uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (local_1c == -1) {
      fprintf(_stderr,
              "av1c: Error reading bit for color_description_present_flag, value=%d result=%d.\n",
              (ulong)uVar2,0xffffffff);
      local_4 = -1;
    }
    else {
      if (uVar2 != 0) {
        local_3c = aom_rb_read_literal((aom_read_bit_buffer *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c);
        if (local_1c == -1) {
          fprintf(_stderr,"av1c: Could not read bits for color_primaries_val, value=%d result=%d.\n"
                  ,(ulong)local_3c,0xffffffff);
          return -1;
        }
        local_40 = aom_rb_read_literal((aom_read_bit_buffer *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c);
        if (local_1c == -1) {
          fprintf(_stderr,
                  "av1c: Could not read bits for transfer_characteristics_val, value=%d result=%d.\n"
                  ,(ulong)local_40,0xffffffff);
          return -1;
        }
        local_44 = aom_rb_read_literal((aom_read_bit_buffer *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c);
        if (local_1c == -1) {
          fprintf(_stderr,
                  "av1c: Could not read bits for matrix_coefficients_val, value=%d result=%d.\n",
                  (ulong)local_44,0xffffffff);
          return -1;
        }
      }
      if (*(char *)(local_18 + 7) == '\0') {
        if (((local_3c == 1) && (local_40 == 0xd)) && (local_44 == 0)) {
          *(undefined1 *)(local_18 + 8) = 0;
          *(undefined1 *)(local_18 + 9) = 0;
        }
        else {
          uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          if (local_1c == -1) {
            fprintf(_stderr,"av1c: Error reading bit for color_range, value=%d result=%d.\n",
                    (ulong)uVar2,0xffffffff);
            return -1;
          }
          if (*(char *)(local_18 + 2) == '\0') {
            *(undefined1 *)(local_18 + 8) = 1;
            *(undefined1 *)(local_18 + 9) = 1;
          }
          else if (*(char *)(local_18 + 2) == '\x01') {
            *(undefined1 *)(local_18 + 8) = 0;
            *(undefined1 *)(local_18 + 9) = 0;
          }
          else if (local_30 == 0xc) {
            uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
            if (local_1c == -1) {
              fprintf(_stderr,"av1c: Error reading bit for subsampling_x, value=%d result=%d.\n",
                      (ulong)uVar2,0xffffffff);
              return -1;
            }
            *(char *)(local_18 + 8) = (char)uVar2;
            if (uVar2 == 0) {
              *(undefined1 *)(local_18 + 9) = 0;
            }
            else {
              in_stack_ffffffffffffff9c =
                   aom_rb_read_bit((aom_read_bit_buffer *)(ulong)in_stack_ffffffffffffff98);
              if (local_1c == -1) {
                fprintf(_stderr,"av1c: Error reading bit for subsampling_y, value=%d result=%d.\n",
                        (ulong)in_stack_ffffffffffffff9c,0xffffffff);
                return -1;
              }
              *(char *)(local_18 + 9) = (char)in_stack_ffffffffffffff9c;
            }
          }
          else {
            *(undefined1 *)(local_18 + 8) = 1;
            *(undefined1 *)(local_18 + 9) = 0;
          }
          if ((*(char *)(local_18 + 8) != '\0') && (*(char *)(local_18 + 9) != '\0')) {
            in_stack_ffffffffffffff98 =
                 aom_rb_read_literal((aom_read_bit_buffer *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     in_stack_ffffffffffffff8c);
            if (local_1c == -1) {
              fprintf(_stderr,
                      "av1c: Could not read bits for chroma_sample_position, value=%d result=%d.\n",
                      (ulong)in_stack_ffffffffffffff98,0xffffffff);
              return -1;
            }
            *(char *)(local_18 + 10) = (char)in_stack_ffffffffffffff98;
          }
        }
      }
      else {
        uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (local_1c == -1) {
          fprintf(_stderr,"av1c: Error reading bit for color_range, value=%d result=%d.\n",
                  (ulong)uVar2,0xffffffff);
          return -1;
        }
        *(undefined1 *)(local_18 + 8) = 1;
        *(undefined1 *)(local_18 + 9) = 1;
      }
      if ((*(char *)(local_18 + 7) == '\0') &&
         (uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
         local_1c == -1)) {
        fprintf(_stderr,"av1c: Error reading bit for separate_uv_delta_q, value=%d result=%d.\n",
                (ulong)uVar2,0xffffffff);
        local_4 = -1;
      }
      else {
        *(undefined8 *)(local_10 + 0x18) = uVar1;
        local_4 = local_1c;
      }
    }
  }
  return local_4;
}

Assistant:

static int parse_color_config(struct aom_read_bit_buffer *reader,
                              Av1Config *config) {
  int result = 0;
  AV1C_PUSH_ERROR_HANDLER_DATA(result);

  AV1C_READ_BIT_OR_RETURN_ERROR(high_bitdepth);
  config->high_bitdepth = high_bitdepth;

  int bit_depth = 0;
  if (config->seq_profile == 2 && config->high_bitdepth) {
    AV1C_READ_BIT_OR_RETURN_ERROR(twelve_bit);
    config->twelve_bit = twelve_bit;
    bit_depth = config->twelve_bit ? 12 : 10;
  } else {
    bit_depth = config->high_bitdepth ? 10 : 8;
  }

  if (config->seq_profile != 1) {
    AV1C_READ_BIT_OR_RETURN_ERROR(mono_chrome);
    config->monochrome = mono_chrome;
  }

  int color_primaries = AOM_CICP_CP_UNSPECIFIED;
  int transfer_characteristics = AOM_CICP_TC_UNSPECIFIED;
  int matrix_coefficients = AOM_CICP_MC_UNSPECIFIED;

  AV1C_READ_BIT_OR_RETURN_ERROR(color_description_present_flag);
  if (color_description_present_flag) {
    AV1C_READ_BITS_OR_RETURN_ERROR(color_primaries_val, 8);
    color_primaries = color_primaries_val;
    AV1C_READ_BITS_OR_RETURN_ERROR(transfer_characteristics_val, 8);
    transfer_characteristics = transfer_characteristics_val;
    AV1C_READ_BITS_OR_RETURN_ERROR(matrix_coefficients_val, 8);
    matrix_coefficients = matrix_coefficients_val;
  }

  if (config->monochrome) {
    AV1C_READ_BIT_OR_RETURN_ERROR(color_range);
    config->chroma_subsampling_x = 1;
    config->chroma_subsampling_y = 1;
  } else if (color_primaries == AOM_CICP_CP_BT_709 &&
             transfer_characteristics == AOM_CICP_TC_SRGB &&
             matrix_coefficients == AOM_CICP_MC_IDENTITY) {
    config->chroma_subsampling_x = 0;
    config->chroma_subsampling_y = 0;
  } else {
    AV1C_READ_BIT_OR_RETURN_ERROR(color_range);
    if (config->seq_profile == 0) {
      config->chroma_subsampling_x = 1;
      config->chroma_subsampling_y = 1;
    } else if (config->seq_profile == 1) {
      config->chroma_subsampling_x = 0;
      config->chroma_subsampling_y = 0;
    } else {
      if (bit_depth == 12) {
        AV1C_READ_BIT_OR_RETURN_ERROR(subsampling_x);
        config->chroma_subsampling_x = subsampling_x;
        if (subsampling_x) {
          AV1C_READ_BIT_OR_RETURN_ERROR(subsampling_y);
          config->chroma_subsampling_y = subsampling_y;
        } else {
          config->chroma_subsampling_y = 0;
        }
      } else {
        config->chroma_subsampling_x = 1;
        config->chroma_subsampling_y = 0;
      }
    }

    if (config->chroma_subsampling_x && config->chroma_subsampling_y) {
      AV1C_READ_BITS_OR_RETURN_ERROR(chroma_sample_position, 2);
      config->chroma_sample_position = chroma_sample_position;
    }
  }

  if (!config->monochrome) {
    AV1C_READ_BIT_OR_RETURN_ERROR(separate_uv_delta_q);
  }

  AV1C_POP_ERROR_HANDLER_DATA();
  return result;
}